

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

int Curl_single_getsock(connectdata *conn,curl_socket_t *sock)

{
  Curl_easy *pCVar1;
  bool bVar2;
  bool local_30;
  uint local_2c;
  uint sockindex;
  int bitmap;
  Curl_easy *data;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  local_30 = false;
  if (conn->handler->perform_getsock == (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
    bVar2 = ((pCVar1->req).keepon & 0x15U) == 1;
    if (bVar2) {
      *sock = conn->sockfd;
    }
    local_2c = (uint)bVar2;
    if (((pCVar1->req).keepon & 0x2aU) == 2) {
      if ((conn->sockfd != conn->writesockfd) || (local_2c == 0)) {
        local_30 = local_2c != 0;
        sock[local_30] = conn->writesockfd;
      }
      local_2c = 1 << (local_30 + 0x10U & 0x1f) | local_2c;
    }
    conn_local._4_4_ = local_2c;
  }
  else {
    conn_local._4_4_ = (*conn->handler->perform_getsock)(conn,sock);
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_single_getsock(const struct connectdata *conn,
                        curl_socket_t *sock)
{
  const struct Curl_easy *data = conn->data;
  int bitmap = GETSOCK_BLANK;
  unsigned sockindex = 0;

  if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(conn, sock);

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_RECVBITS) == KEEP_RECV) {

    DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);

    bitmap |= GETSOCK_READSOCK(sockindex);
    sock[sockindex] = conn->sockfd;
  }

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) {

    if((conn->sockfd != conn->writesockfd) ||
       bitmap == GETSOCK_BLANK) {
      /* only if they are not the same socket and we have a readable
         one, we increase index */
      if(bitmap != GETSOCK_BLANK)
        sockindex++; /* increase index if we need two entries */

      DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);

      sock[sockindex] = conn->writesockfd;
    }

    bitmap |= GETSOCK_WRITESOCK(sockindex);
  }

  return bitmap;
}